

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfCloseTiledInputFile(ImfTiledInputFile *in)

{
  if (in != (ImfTiledInputFile *)0x0) {
    (**(code **)(*(long *)in + 8))();
  }
  return 1;
}

Assistant:

int
ImfCloseTiledInputFile (ImfTiledInputFile* in)
{
    try
    {
        delete infile (in);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}